

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  SimpleBinsSelectExprSyntax *pSVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor local_22;
  DeepCloneVisitor local_21;
  MatchesClauseSyntax *local_20;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),&local_22,(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x20) == (SyntaxNode *)0x0) {
    local_20 = (MatchesClauseSyntax *)0x0;
  }
  else {
    local_20 = (MatchesClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x20),&local_21,(BumpAllocator *)__child_stack);
  }
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SimpleBinsSelectExprSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::MatchesClauseSyntax*>
                     ((BumpAllocator *)__child_stack,(ExpressionSyntax *)args,&local_20);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SimpleBinsSelectExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SimpleBinsSelectExprSyntax>(
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.matchesClause ? deepClone(*node.matchesClause, alloc) : nullptr
    );
}